

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void __thiscall
lodepng::ExtractZlib::inflate
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in,size_t inpos)

{
  size_t sVar1;
  ExtractZlib *this_00;
  ExtractZlib *pEVar2;
  const_reference pvVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  reference pvVar6;
  size_t *bp_00;
  int iVar7;
  size_type in_RCX;
  long lVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *in_RSI;
  ExtractZlib *in_RDI;
  bool bVar9;
  size_t *unaff_retaddr;
  size_t *in_stack_00000008;
  uchar *in_stack_00000010;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000018;
  ExtractZlib *in_stack_00000020;
  unsigned_long in_stack_00000030;
  size_t uncomprblocksize;
  unsigned_long BTYPE;
  size_t bpstart;
  size_t uncomprblockstart;
  unsigned_long BFINAL;
  size_t pos;
  size_t bp;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *in_stack_ffffffffffffff50
  ;
  const_reference in_stack_ffffffffffffff68;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *in_stack_ffffffffffffff70
  ;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *in_00;
  undefined4 in_stack_ffffffffffffff88;
  unsigned_long local_38;
  size_t local_28;
  size_type local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *local_10;
  ExtractZlib *inlength;
  
  local_28 = 0;
  in_RDI->error = 0;
  local_38 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  inlength = in_RDI;
  while( true ) {
    sVar1 = local_28;
    bVar9 = false;
    if (local_38 == 0) {
      bVar9 = in_RDI->error == 0;
    }
    if (!bVar9) {
      return;
    }
    this_00 = (ExtractZlib *)(local_28 >> 3);
    pEVar2 = (ExtractZlib *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
    if (pEVar2 <= this_00) {
      in_RDI->error = 0x34;
      return;
    }
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_18,local_20);
    local_38 = readBitFromStream(in_RDI,&local_28,pvVar3);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_18,local_20);
    uVar4 = readBitFromStream(in_RDI,&local_28,pvVar3);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_18,local_20);
    uVar5 = readBitFromStream(in_RDI,&local_28,pvVar3);
    lVar8 = uVar5 * 2 + uVar4;
    in_00 = in_RDI->zlibinfo;
    std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::size
              (in_RDI->zlibinfo);
    std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::resize
              (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
    iVar7 = (int)lVar8;
    pvVar6 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                       (in_stack_ffffffffffffff50);
    pvVar6->btype = iVar7;
    if (lVar8 == 3) break;
    if (lVar8 == 0) {
      in_stack_ffffffffffffff70 = local_10;
      bp_00 = (size_t *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        (local_18,local_20);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
      inflateNoCompression
                (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(iVar7,in_stack_ffffffffffffff88),(uchar *)in_00,bp_00,
                 (size_t *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    }
    else {
      in_stack_ffffffffffffff68 =
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_18,local_20)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
      inflateHuffmanBlock(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                          unaff_retaddr,(size_t)inlength,in_stack_00000030);
    }
    in_stack_ffffffffffffff50 =
         (vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *)
         (local_28 - sVar1);
    pvVar6 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                       (in_stack_ffffffffffffff50);
    pvVar6->compressedbits = (size_t)in_stack_ffffffffffffff50;
    pvVar6 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                       (in_stack_ffffffffffffff50);
    pvVar6->uncompressedbytes = 0;
  }
  in_RDI->error = 0x14;
  return;
}

Assistant:

void inflate(std::vector<unsigned char>& out, const std::vector<unsigned char>& in, size_t inpos = 0) {
    size_t bp = 0, pos = 0; //bit pointer and byte pointer
    error = 0;
    unsigned long BFINAL = 0;
    while(!BFINAL && !error) {
      size_t uncomprblockstart = pos;
      size_t bpstart = bp;
      if(bp >> 3 >= in.size()) { error = 52; return; } //error, bit pointer will jump past memory
      BFINAL = readBitFromStream(bp, &in[inpos]);
      unsigned long BTYPE = readBitFromStream(bp, &in[inpos]); BTYPE += 2 * readBitFromStream(bp, &in[inpos]);
      zlibinfo->resize(zlibinfo->size() + 1);
      zlibinfo->back().btype = BTYPE;
      if(BTYPE == 3) { error = 20; return; } //error: invalid BTYPE
      else if(BTYPE == 0) inflateNoCompression(out, &in[inpos], bp, pos, in.size());
      else inflateHuffmanBlock(out, &in[inpos], bp, pos, in.size(), BTYPE);
      size_t uncomprblocksize = pos - uncomprblockstart;
      zlibinfo->back().compressedbits = bp - bpstart;
      zlibinfo->back().uncompressedbytes = uncomprblocksize;
    }
  }